

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

DefaultRsCaseItemSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefaultRsCaseItemSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::RsProdItemSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1,RsProdItemSyntax *args_2,Token *args_3)

{
  Info *pIVar1;
  Info *pIVar2;
  Info *pIVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  TokenKind TVar8;
  undefined1 uVar9;
  NumericTokenFlags NVar10;
  uint32_t uVar11;
  TokenKind TVar12;
  undefined1 uVar13;
  NumericTokenFlags NVar14;
  uint32_t uVar15;
  DefaultRsCaseItemSyntax *pDVar16;
  
  pDVar16 = (DefaultRsCaseItemSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DefaultRsCaseItemSyntax *)this->endPtr < pDVar16 + 1) {
    pDVar16 = (DefaultRsCaseItemSyntax *)allocateSlow(this,0x48,8);
  }
  else {
    this->head->current = (byte *)(pDVar16 + 1);
  }
  TVar4 = args->kind;
  uVar5 = args->field_0x2;
  NVar6.raw = (args->numFlags).raw;
  uVar7 = args->rawLen;
  pIVar1 = args->info;
  TVar8 = args_1->kind;
  uVar9 = args_1->field_0x2;
  NVar10.raw = (args_1->numFlags).raw;
  uVar11 = args_1->rawLen;
  pIVar2 = args_1->info;
  TVar12 = args_3->kind;
  uVar13 = args_3->field_0x2;
  NVar14.raw = (args_3->numFlags).raw;
  uVar15 = args_3->rawLen;
  pIVar3 = args_3->info;
  (pDVar16->super_RsCaseItemSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pDVar16->super_RsCaseItemSyntax).super_SyntaxNode.kind = DefaultRsCaseItem;
  (pDVar16->defaultKeyword).kind = TVar4;
  (pDVar16->defaultKeyword).field_0x2 = uVar5;
  (pDVar16->defaultKeyword).numFlags = (NumericTokenFlags)NVar6.raw;
  (pDVar16->defaultKeyword).rawLen = uVar7;
  (pDVar16->defaultKeyword).info = pIVar1;
  (pDVar16->colon).kind = TVar8;
  (pDVar16->colon).field_0x2 = uVar9;
  (pDVar16->colon).numFlags = (NumericTokenFlags)NVar10.raw;
  (pDVar16->colon).rawLen = uVar11;
  (pDVar16->colon).info = pIVar2;
  (pDVar16->item).ptr = args_2;
  (pDVar16->semi).kind = TVar12;
  (pDVar16->semi).field_0x2 = uVar13;
  (pDVar16->semi).numFlags = (NumericTokenFlags)NVar14.raw;
  (pDVar16->semi).rawLen = uVar15;
  (pDVar16->semi).info = pIVar3;
  (args_2->super_RsProdSyntax).super_SyntaxNode.parent = (SyntaxNode *)pDVar16;
  return pDVar16;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }